

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O1

void __thiscall
QHttpNetworkReplyPrivate::QHttpNetworkReplyPrivate(QHttpNetworkReplyPrivate *this,QUrl *newUrl)

{
  char cVar1;
  long in_FS_OFFSET;
  QLatin1String QVar2;
  QLatin1String QVar3;
  QStringView QVar4;
  QStringView QVar5;
  QUrl local_48;
  storage_type_conflict *psStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  QHttpNetworkHeaderPrivate::QHttpNetworkHeaderPrivate
            (&this->super_QHttpNetworkHeaderPrivate,newUrl);
  *(undefined ***)this = &PTR__QHttpNetworkReplyPrivate_002d3b38;
  this->state = NothingDoneState;
  QUrl::QUrl(&local_48);
  QHttpNetworkRequest::QHttpNetworkRequest(&this->request,&local_48,Get,NormalPriority);
  QUrl::~QUrl(&local_48);
  this->ssl = false;
  (this->errorString).d.d = (Data *)0x0;
  (this->errorString).d.ptr = (char16_t *)0x0;
  (this->errorString).d.size = 0;
  this->bodyLength = 0;
  this->contentRead = 0;
  this->totalProgress = 0;
  (this->fragment).d.d = (Data *)0x0;
  (this->fragment).d.ptr = (char *)0x0;
  *(undefined8 *)((long)&(this->fragment).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this->fragment).d.size + 1) = 0;
  this->connectionCloseEnabled = true;
  this->forceConnectionCloseEnabled = false;
  this->lastChunkRead = false;
  this->currentChunkSize = 0;
  this->currentChunkRead = 0;
  this->readBufferMaxSize = 0;
  this->totallyUploadedData = 0;
  this->removedContentLength = -1;
  this->userProvidedDownloadBuffer = (char *)0x0;
  (this->connection).wp.d = (Data *)0x0;
  (this->connection).wp.value = (QObject *)0x0;
  (this->connectionChannel).wp.d = (Data *)0x0;
  (this->connectionChannel).wp.value = (QObject *)0x0;
  *(undefined8 *)((long)&(this->connectionChannel).wp.value + 5) = 0;
  (this->responseData).buffers.d.d = (Data *)0x0;
  (this->responseData).buffers.d.ptr = (QByteArray *)0x0;
  (this->responseData).buffers.d.size = 0;
  (this->responseData).bufferCompleteSize = 0;
  *(undefined8 *)((long)&(this->responseData).bufferCompleteSize + 4) = 0;
  *(undefined8 *)((long)&(this->responseData).firstPos + 4) = 0;
  QUrl::QUrl(&this->redirectUrl);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_40 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::scheme();
  if (local_38 == (undefined1 *)0x10) {
    QVar3.m_data = "preconnect-https";
    QVar3.m_size = 0x10;
    QVar5.m_data = psStack_40;
    QVar5.m_size = 0x10;
    cVar1 = QtPrivate::equalStrings(QVar5,QVar3);
  }
  else {
    if (local_38 != (undefined1 *)0xf) goto LAB_0020cf4f;
    QVar2.m_data = "preconnect-http";
    QVar2.m_size = 0xf;
    QVar4.m_data = psStack_40;
    QVar4.m_size = 0xf;
    cVar1 = QtPrivate::equalStrings(QVar4,QVar2);
  }
  if (cVar1 != '\0') {
    this->connectionCloseEnabled = false;
  }
LAB_0020cf4f:
  if ((QArrayData *)local_48.d != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_48.d = *(int *)local_48.d + -1;
    UNLOCK();
    if (*(int *)local_48.d == 0) {
      QArrayData::deallocate((QArrayData *)local_48.d,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QHttpNetworkReplyPrivate::QHttpNetworkReplyPrivate(const QUrl &newUrl)
    : QHttpNetworkHeaderPrivate(newUrl)
    , state(NothingDoneState)
    , ssl(false),
      bodyLength(0), contentRead(0), totalProgress(0),
      chunkedTransferEncoding(false),
      connectionCloseEnabled(true),
      forceConnectionCloseEnabled(false),
      lastChunkRead(false),
      currentChunkSize(0), currentChunkRead(0), readBufferMaxSize(0),
      totallyUploadedData(0),
      removedContentLength(-1),
      connection(nullptr),
      autoDecompress(false), responseData(), requestIsPrepared(false)
      ,pipeliningUsed(false), h2Used(false), downstreamLimited(false)
      ,userProvidedDownloadBuffer(nullptr)

{
    QString scheme = newUrl.scheme();
    if (scheme == "preconnect-http"_L1 || scheme == "preconnect-https"_L1)
        // make sure we do not close the socket after preconnecting
        connectionCloseEnabled = false;
}